

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O3

RelatedFullDocumentDiagnosticReport *
my_lsp_server::lscpp_handle_diagnostic_report
          (RelatedFullDocumentDiagnosticReport *__return_storage_ptr__,server *param_1,
          DocumentDiagnosticParams *param_2)

{
  initializer_list<lscpp::protocol::Diagnostic> __l;
  allocator_type local_c9;
  undefined1 local_c8 [112];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Storage<std::vector<lscpp::protocol::DiagnosticTag,_std::allocator<lscpp::protocol::DiagnosticTag>_>,_false>
  local_38;
  bool local_20;
  
  *(undefined1 **)
   &(__return_storage_ptr__->super_FullDocumentDiagnosticReport).resultId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload =
       (undefined1 *)
       ((long)&(__return_storage_ptr__->super_FullDocumentDiagnosticReport).resultId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"foo","");
  (__return_storage_ptr__->super_FullDocumentDiagnosticReport).resultId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
  local_c8._0_4_ = 2;
  local_c8._4_4_ = 1;
  local_c8._8_4_ = 2;
  local_c8._12_4_ = 5;
  local_c8._16_4_ = Error;
  local_c8[0x14] = true;
  local_c8[0x40] = false;
  local_c8[0x68] = false;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Oh that\'s stupid!","");
  local_20 = false;
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  std::vector<lscpp::protocol::Diagnostic,_std::allocator<lscpp::protocol::Diagnostic>_>::vector
            (&(__return_storage_ptr__->super_FullDocumentDiagnosticReport).items,__l,&local_c9);
  if (local_20 == true) {
    local_20 = false;
    if (local_38._M_value.
        super__Vector_base<lscpp::protocol::DiagnosticTag,_std::allocator<lscpp::protocol::DiagnosticTag>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38._M_value.
                      super__Vector_base<lscpp::protocol::DiagnosticTag,_std::allocator<lscpp::protocol::DiagnosticTag>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38._M_value.
                            super__Vector_base<lscpp::protocol::DiagnosticTag,_std::allocator<lscpp::protocol::DiagnosticTag>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - local_38._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if (local_c8[0x68] == true) {
    local_c8[0x68] = false;
    if ((undefined1 *)local_c8._72_8_ != local_c8 + 0x58) {
      operator_delete((void *)local_c8._72_8_,local_c8._88_8_ + 1);
    }
  }
  if (local_c8[0x40] == true) {
    std::
    _Optional_payload_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_destroy((_Optional_payload_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_c8 + 0x18));
  }
  return __return_storage_ptr__;
}

Assistant:

lscpp::protocol::RelatedFullDocumentDiagnosticReport
  lscpp_handle_diagnostic_report(server &,
                                 lscpp::protocol::DocumentDiagnosticParams) {
    return {{"foo",
             {lscpp::protocol::Diagnostic{
                 lscpp::protocol::Range{{2, 1}, {2, 5}},
                 lscpp::protocol::DiagnosticSeverity::Error,
                 {},
                 {},
                 "Oh that's stupid!"}}}};
  }